

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

int32_t __thiscall
icu_63::Calendar::getWeekendTransition
          (Calendar *this,UCalendarDaysOfWeek dayOfWeek,UErrorCode *status)

{
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  if (this->fWeekendOnset == dayOfWeek) {
    return this->fWeekendOnsetMillis;
  }
  if (this->fWeekendCease == dayOfWeek) {
    return this->fWeekendCeaseMillis;
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

int32_t
Calendar::getWeekendTransition(UCalendarDaysOfWeek dayOfWeek, UErrorCode &status) const
{
    if (U_FAILURE(status)) {
        return 0;
    }
    if (dayOfWeek == fWeekendOnset) {
        return fWeekendOnsetMillis;
    } else if (dayOfWeek == fWeekendCease) {
        return fWeekendCeaseMillis;
    }
    status = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
}